

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O3

void test_2d_static<5ul,0ul,30ul,1ul>(void)

{
  int line;
  char *expr2;
  int i_2;
  bool *pbVar1;
  int i;
  bool *pbVar2;
  int i_1;
  size_t true_idx;
  int dptr [35];
  bool *local_e0;
  bool *local_d8;
  bool *local_d0;
  bool local_c8 [152];
  
  local_c8[0] = true;
  local_d8 = (bool *)CONCAT71(local_d8._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1d,"void test_2d_static() [N = 5UL, M = 0UL, X = 30UL, Y = 1UL]",local_c8,
             (bool *)&local_d8);
  local_c8[0] = true;
  local_c8[1] = false;
  local_c8[2] = false;
  local_c8[3] = false;
  local_c8[4] = false;
  local_c8[5] = false;
  local_c8[6] = false;
  local_c8[7] = false;
  local_d8._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1f,"void test_2d_static() [N = 5UL, M = 0UL, X = 30UL, Y = 1UL]",
             (unsigned_long *)local_c8,(int *)&local_d8);
  local_c8[0] = true;
  local_c8[1] = false;
  local_c8[2] = false;
  local_c8[3] = false;
  local_c8[4] = false;
  local_c8[5] = false;
  local_c8[6] = false;
  local_c8[7] = false;
  local_d8 = (bool *)CONCAT44(local_d8._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x20,"void test_2d_static() [N = 5UL, M = 0UL, X = 30UL, Y = 1UL]",
             (unsigned_long *)local_c8,(int *)&local_d8);
  local_c8[0] = true;
  local_c8[1] = false;
  local_c8[2] = false;
  local_c8[3] = false;
  local_c8[4] = false;
  local_c8[5] = false;
  local_c8[6] = false;
  local_c8[7] = false;
  local_d8 = (bool *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x22,"void test_2d_static() [N = 5UL, M = 0UL, X = 30UL, Y = 1UL]",
             (unsigned_long *)local_c8,(unsigned_long *)&local_d8);
  local_c8[0] = true;
  local_c8[1] = false;
  local_c8[2] = false;
  local_c8[3] = false;
  local_c8[4] = false;
  local_c8[5] = false;
  local_c8[6] = false;
  local_c8[7] = false;
  local_d8 = (bool *)0x23;
  pbVar1 = local_c8;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x23,"void test_2d_static() [N = 5UL, M = 0UL, X = 30UL, Y = 1UL]",
             (unsigned_long *)pbVar1,(unsigned_long *)&local_d8);
  pbVar2 = (bool *)0x0;
  do {
    local_e0 = pbVar2;
    local_d8 = pbVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x2d,"void test_2d_static() [N = 5UL, M = 0UL, X = 30UL, Y = 1UL]",
               (unsigned_long *)&local_e0,(unsigned_long *)&local_d8);
    local_d0 = local_c8 + (long)local_d8 * 4;
    local_e0 = pbVar1;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x2f,"void test_2d_static() [N = 5UL, M = 0UL, X = 30UL, Y = 1UL]",(int **)&local_e0
               ,(int **)&local_d0);
    pbVar1[0] = true;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    local_e0 = (bool *)CONCAT44(local_e0._4_4_,0x2a);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","42",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x33,"void test_2d_static() [N = 5UL, M = 0UL, X = 30UL, Y = 1UL]",(int *)pbVar1,
               (int *)&local_e0);
    pbVar2 = pbVar2 + 1;
    pbVar1 = pbVar1 + 4;
  } while (pbVar2 != (bool *)0x1e);
  pbVar1 = local_c8;
  pbVar2 = (bool *)0x0;
  do {
    local_e0 = pbVar2;
    local_d8 = pbVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x3c,"void test_2d_static() [N = 5UL, M = 0UL, X = 30UL, Y = 1UL]",
               (unsigned_long *)&local_e0,(unsigned_long *)&local_d8);
    local_d0 = local_c8 + (long)local_d8 * 4;
    local_e0 = pbVar1;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x3e,"void test_2d_static() [N = 5UL, M = 0UL, X = 30UL, Y = 1UL]",(int **)&local_e0
               ,(int **)&local_d0);
    if ((bool *)0x1d < pbVar2) {
      pbVar1[0] = true;
      pbVar1[1] = false;
      pbVar1[2] = false;
      pbVar1[3] = false;
      local_e0 = (bool *)CONCAT44(local_e0._4_4_,0x11);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x45,"void test_2d_static() [N = 5UL, M = 0UL, X = 30UL, Y = 1UL]",(int *)pbVar1,
                 (int *)&local_e0);
    }
    pbVar2 = pbVar2 + 1;
    pbVar1 = pbVar1 + 4;
  } while (pbVar2 != (bool *)&DAT_00000023);
  pbVar1 = local_c8;
  pbVar2 = (bool *)0x0;
  do {
    local_e0 = pbVar2;
    local_d8 = pbVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x57,"void test_2d_static() [N = 5UL, M = 0UL, X = 30UL, Y = 1UL]",
               (unsigned_long *)&local_e0,(unsigned_long *)&local_d8);
    local_d0 = local_c8 + (long)local_d8 * 4;
    local_e0 = pbVar1;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x59,"void test_2d_static() [N = 5UL, M = 0UL, X = 30UL, Y = 1UL]",(int **)&local_e0
               ,(int **)&local_d0);
    if (pbVar2 < (bool *)0x1e) {
      local_e0 = (bool *)CONCAT44(local_e0._4_4_,0x2a);
      expr2 = "42";
      line = 0x6a;
    }
    else {
      local_e0 = (bool *)CONCAT44(local_e0._4_4_,0x11);
      expr2 = "17";
      line = 0x5e;
    }
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])",expr2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,line,"void test_2d_static() [N = 5UL, M = 0UL, X = 30UL, Y = 1UL]",(int *)pbVar1,
               (int *)&local_e0);
    pbVar2 = pbVar2 + 1;
    pbVar1 = pbVar1 + 4;
  } while (pbVar2 != (bool *)&DAT_00000023);
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<N, M>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    int dptr[(X + N) * (Y + M)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}